

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O2

ValueVectorOf<xercesc_4_0::PrefMapElem_*> * __thiscall
xercesc_4_0::ElemStack::getNamespaceMap(ElemStack *this)

{
  StackElem *pSVar1;
  XMLSize_t mapIndex;
  ulong uVar2;
  XMLSize_t mapIndex_1;
  ulong uVar3;
  long lVar4;
  XMLSize_t XVar5;
  bool bVar6;
  PrefMapElem *local_38;
  
  this->fNamespaceMap->fCurCount = 0;
  XVar5 = this->fStackTop;
  while (bVar6 = XVar5 != 0, XVar5 = XVar5 - 1, bVar6) {
    pSVar1 = this->fStack[XVar5];
    uVar3 = pSVar1->fMapCount;
    if (uVar3 != 0) {
      lVar4 = 0;
      for (uVar2 = 0; uVar2 < uVar3; uVar2 = uVar2 + 1) {
        local_38 = (PrefMapElem *)((long)&pSVar1->fMap->fPrefId + lVar4);
        ValueVectorOf<xercesc_4_0::PrefMapElem_*>::addElement(this->fNamespaceMap,&local_38);
        uVar3 = pSVar1->fMapCount;
        lVar4 = lVar4 + 8;
      }
    }
  }
  pSVar1 = this->fGlobalNamespaces;
  if (pSVar1 != (StackElem *)0x0) {
    lVar4 = 0;
    for (uVar3 = 0; uVar3 < pSVar1->fMapCount; uVar3 = uVar3 + 1) {
      local_38 = (PrefMapElem *)((long)&pSVar1->fMap->fPrefId + lVar4);
      ValueVectorOf<xercesc_4_0::PrefMapElem_*>::addElement(this->fNamespaceMap,&local_38);
      pSVar1 = this->fGlobalNamespaces;
      lVar4 = lVar4 + 8;
    }
  }
  return this->fNamespaceMap;
}

Assistant:

ValueVectorOf<PrefMapElem*>* ElemStack::getNamespaceMap() const
{
    fNamespaceMap->removeAllElements();

    //  Start at the stack top and work backwards until we come to some
    //  element that mapped this prefix.
    for (XMLSize_t index = fStackTop; index > 0; index--)
    {
        // Get a convenience pointer to the current element
        StackElem* curRow = fStack[index-1];

        // If no prefixes mapped at this level, then go the next one
        if (!curRow->fMapCount)
            continue;

        // Search the map at this level for the passed prefix
        for (XMLSize_t mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
            fNamespaceMap->addElement(&(curRow->fMap[mapIndex]));
    }
    //  Add the global namespaces
    if(fGlobalNamespaces)
    {
        for (XMLSize_t mapIndex = 0; mapIndex < fGlobalNamespaces->fMapCount; mapIndex++)
            fNamespaceMap->addElement(&(fGlobalNamespaces->fMap[mapIndex]));
    }

    return fNamespaceMap;
}